

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall
benchmark::internal::BenchmarkImp::Ranges
          (BenchmarkImp *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges)

{
  pointer pvVar1;
  pointer *ppiVar2;
  pointer pvVar3;
  int *__args;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  arglists;
  vector<int,_std::allocator<int>_> tmp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ctr;
  allocator_type local_81;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_80;
  void *local_68;
  iterator iStack_60;
  int *local_58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_80,*(long *)(ranges + 8) - *(long *)ranges >> 3,(allocator_type *)&local_48);
  lVar6 = *(long *)ranges;
  if (*(long *)(ranges + 8) == lVar6) {
    iVar5 = 1;
  }
  else {
    iVar5 = 1;
    lVar4 = 0;
    uVar8 = 0;
    do {
      AddRange((vector<int,_std::allocator<int>_> *)
               ((long)&((local_80.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar4),*(int *)(lVar6 + uVar8 * 8),
               *(int *)(lVar6 + 4 + uVar8 * 8),this->range_multiplier_);
      iVar5 = iVar5 * (int)((ulong)(*(long *)((long)&((local_80.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish + lVar4)
                                   - *(long *)((long)&((local_80.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start + lVar4))
                           >> 2);
      uVar8 = uVar8 + 1;
      lVar6 = *(long *)ranges;
      lVar4 = lVar4 + 0x18;
    } while (uVar8 < (ulong)(*(long *)(ranges + 8) - lVar6 >> 3));
  }
  local_68 = (void *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,(long)iVar5,(value_type_conflict2 *)&local_68,&local_81);
  if (0 < iVar5) {
    local_50 = &this->args_;
    iVar7 = 0;
    do {
      local_68 = (void *)0x0;
      iStack_60._M_current = (int *)0x0;
      local_58 = (int *)0x0;
      if (local_80.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_80.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar6 = 0;
        uVar8 = 0;
        pvVar1 = local_80.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = local_80.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          __args = (int *)(local_48.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar8] * 4 +
                          *(long *)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar6));
          if (iStack_60._M_current == local_58) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_68,iStack_60,__args);
            pvVar1 = local_80.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar3 = local_80.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *iStack_60._M_current = *__args;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          uVar8 = uVar8 + 1;
          lVar6 = lVar6 + 0x18;
        } while (uVar8 < (ulong)(((long)pvVar3 - (long)pvVar1 >> 3) * -0x5555555555555555));
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(local_50,(value_type *)&local_68);
      if ((long)local_80.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_80.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar6 = ((long)local_80.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        ppiVar2 = &((local_80.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                   _M_finish;
        lVar4 = 0;
        do {
          if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4] + 1 <
              (ulong)((long)*ppiVar2 - (long)((_Vector_impl_data *)(ppiVar2 + -1))->_M_start >> 2))
          {
            local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] =
                 local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4] + 1;
            break;
          }
          local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4] = 0;
          lVar4 = lVar4 + 1;
          ppiVar2 = ppiVar2 + 3;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar4);
      }
      if (local_68 != (void *)0x0) {
        operator_delete(local_68);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar5);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_80);
  return;
}

Assistant:

void BenchmarkImp::Ranges(const std::vector<std::pair<int, int>>& ranges) {
  std::vector<std::vector<int>> arglists(ranges.size());
  int total = 1;
  for (std::size_t i = 0; i < ranges.size(); i++) {
    AddRange(&arglists[i], ranges[i].first, ranges[i].second, range_multiplier_);
    total *= arglists[i].size();
  }

  std::vector<std::size_t> ctr(total, 0);

  for (int i = 0; i < total; i++) {
    std::vector<int> tmp;

    for (std::size_t j = 0; j < arglists.size(); j++) {
      tmp.push_back(arglists[j][ctr[j]]);
    }

    args_.push_back(tmp);

    for (std::size_t j = 0; j < arglists.size(); j++) {
      if (ctr[j] + 1 < arglists[j].size()) {
        ++ctr[j];
        break;
      }
      ctr[j] = 0;
    }
  }
}